

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.hpp
# Opt level: O2

void ixy::printList<ixy::Pair<ixy::Pair<ixy::None,char_const*>,unsigned_int_const&>,char_const*>
               (ostream *os,
               Pair<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_const_unsigned_int_&>,_const_char_*>
               *data)

{
  printList<ixy::Pair<ixy::None,char_const*>,unsigned_int_const&>(os,&data->first);
  std::operator<<(os,data->second);
  return;
}

Assistant:

void printList(std::ostream &os, const Pair<Begin, Last> &data) {
    printList(os, data.first);
    os << data.second;
}